

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<float,_4U>::getUINTPacked
          (ImageT<float,_4U> *this,uint32_t c0,uint32_t c1,uint32_t c2,uint32_t c3)

{
  int iVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  long lVar12;
  color<float,_4U> *this_00;
  uchar *puVar13;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  int in_R8D;
  int in_R9D;
  uint32_t pack;
  uchar *target;
  Color *pixel;
  uint32_t x;
  uint32_t y;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  allocator_type *__a;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 uVar14;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  uint local_3c;
  uint local_38;
  allocator_type local_22;
  undefined1 local_21;
  int local_20;
  int local_1c;
  int local_18;
  
  if (in_EDX + in_ECX + in_R8D + in_R9D != 0x20) {
    __assert_fail("c0 + c1 + c2 + c3 == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x419,
                  "virtual std::vector<uint8_t> ImageT<float, 4>::getUINTPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = float, componentCount = 4]"
                 );
  }
  uVar14 = false;
  if (((in_EDX != 0) && (uVar14 = false, in_ECX != 0)) && (uVar14 = false, in_R8D != 0)) {
    uVar14 = in_R9D != 0;
  }
  if ((bool)uVar14 != false) {
    local_21 = 0;
    lVar12 = (ulong)(uint)(*(int *)(in_RSI + 0xc) * *(int *)(in_RSI + 8)) << 2;
    __a = &local_22;
    this_01 = in_RDI;
    local_20 = in_R9D;
    local_1c = in_R8D;
    local_18 = in_ECX;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x2466d4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (this_01,CONCAT17(uVar14,in_stack_ffffffffffffff88),__a);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x2466f4);
    for (local_38 = 0; local_38 < *(uint *)(in_RSI + 0xc); local_38 = local_38 + 1) {
      for (local_3c = 0; local_3c < *(uint *)(in_RSI + 8); local_3c = local_3c + 1) {
        this_00 = (color<float,_4U> *)
                  (*(long *)(in_RSI + 0x18) +
                  (ulong)(local_38 * *(int *)(in_RSI + 8) + local_3c) * 0x10);
        puVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x246757);
        iVar1 = *(int *)(in_RSI + 8);
        color<float,_4U>::operator[](this_00,0);
        uVar8 = imageio::convertUINT
                          ((uint32_t)((ulong)__a >> 0x20),(uint32_t)__a,
                           (uint32_t)((ulong)lVar12 >> 0x20));
        cVar6 = (char)local_18;
        cVar7 = (char)local_1c;
        cVar3 = (char)local_20;
        color<float,_4U>::operator[](this_00,1);
        uVar9 = imageio::convertUINT
                          ((uint32_t)((ulong)__a >> 0x20),(uint32_t)__a,
                           (uint32_t)((ulong)lVar12 >> 0x20));
        cVar4 = (char)local_1c;
        cVar5 = (char)local_20;
        color<float,_4U>::operator[](this_00,2);
        uVar10 = imageio::convertUINT
                           ((uint32_t)((ulong)__a >> 0x20),(uint32_t)__a,
                            (uint32_t)((ulong)lVar12 >> 0x20));
        bVar2 = (byte)local_20 & 0x1f;
        color<float,_4U>::operator[](this_00,3);
        uVar11 = imageio::convertUINT
                           ((uint32_t)((ulong)__a >> 0x20),(uint32_t)__a,
                            (uint32_t)((ulong)lVar12 >> 0x20));
        *(uint32_t *)(puVar13 + (ulong)(local_38 * iVar1 + local_3c) * 4) =
             uVar11 | uVar8 << (cVar6 + cVar7 + cVar3 & 0x1fU) | uVar9 << (cVar4 + cVar5 & 0x1fU) |
                      uVar10 << bVar2;
      }
    }
    return in_RDI;
  }
  __assert_fail("c0 != 0 && c1 != 0 && c2 != 0 && c3 != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x41a,
                "virtual std::vector<uint8_t> ImageT<float, 4>::getUINTPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = float, componentCount = 4]"
               );
}

Assistant:

virtual std::vector<uint8_t> getUINTPacked(uint32_t c0, uint32_t c1, uint32_t c2, uint32_t c3) const override {
        assert(c0 + c1 + c2 + c3 == 32);
        assert(c0 != 0 && c1 != 0 && c2 != 0 && c3 != 0);
        assert(componentCount == 4);

        std::vector<uint8_t> data(height * width * sizeof(uint32_t));
        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                const auto& pixel = pixels[y * width + x];
                auto* target = data.data() + (y * width + x) * sizeof(uint32_t);

                uint32_t pack = 0;
                pack |= imageio::convertUINT(static_cast<uint32_t>(pixel[0]), sizeof(uint32_t) * 8, c0) << (c1 + c2 + c3);
                pack |= imageio::convertUINT(static_cast<uint32_t>(pixel[1]), sizeof(uint32_t) * 8, c1) << (c2 + c3);
                pack |= imageio::convertUINT(static_cast<uint32_t>(pixel[2]), sizeof(uint32_t) * 8, c2) << c3;
                pack |= imageio::convertUINT(static_cast<uint32_t>(pixel[3]), sizeof(uint32_t) * 8, c3);

                std::memcpy(target, &pack, sizeof(pack));
            }
        }

        return data;
    }